

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_gamemtls_lib.cxx
# Opt level: O3

void __thiscall xray_re::xr_gamemtl::load(xr_gamemtl *this,xr_reader *r)

{
  uint32_t *puVar1;
  float *pfVar2;
  size_t sVar3;
  
  sVar3 = xr_reader::find_chunk(r,0x1000);
  if (sVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_gamemtls_lib.cxx"
                  ,0x11,"void xray_re::xr_gamemtl::load(xr_reader &)");
  }
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  this->id = *puVar1;
  xr_reader::r_sz(r,&this->name);
  sVar3 = xr_reader::find_chunk(r,0x1005);
  if (sVar3 != 0) {
    xr_reader::r_sz(r,&this->desc);
  }
  sVar3 = xr_reader::find_chunk(r,0x1001);
  if (sVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_gamemtls_lib.cxx"
                  ,0x1c,"void xray_re::xr_gamemtl::load(xr_reader &)");
  }
  puVar1 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar1 + 1);
  this->flags = *puVar1;
  sVar3 = xr_reader::find_chunk(r,0x1002);
  if (sVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_gamemtls_lib.cxx"
                  ,0x21,"void xray_re::xr_gamemtl::load(xr_reader &)");
  }
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  this->friction = *pfVar2;
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  this->damping = *pfVar2;
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  this->spring = *pfVar2;
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  this->bouncing_start_velocity = *pfVar2;
  pfVar2 = (float *)(r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
  this->bounce = *pfVar2;
  sVar3 = xr_reader::find_chunk(r,0x1003);
  if (sVar3 != 0) {
    pfVar2 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    this->shoot_factor = *pfVar2;
    pfVar2 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    this->bounce_damage_factor = *pfVar2;
    pfVar2 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    this->vis_transparency_factor = *pfVar2;
    pfVar2 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    this->snd_occlusion_factor = *pfVar2;
    sVar3 = xr_reader::r_raw_chunk(r,0x1004,&this->flotation_factor,4);
    if (sVar3 == 0) {
      this->flotation_factor = 1.0;
    }
    sVar3 = xr_reader::r_raw_chunk(r,0x1006,&this->injurious_speed,4);
    if (sVar3 == 0) {
      this->injurious_speed = 0.0;
    }
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_gamemtls_lib.cxx"
                ,0x2a,"void xray_re::xr_gamemtl::load(xr_reader &)");
}

Assistant:

void xr_gamemtl::load(xr_reader& r)
{
	if (!r.find_chunk(GAMEMTL_CHUNK_MAIN))
		xr_not_expected();
	id = r.r_u32();
	r.r_sz(name);
	r.debug_find_chunk();

	if (r.find_chunk(GAMEMTL_CHUNK_DESC)) {
		r.r_sz(desc);
		r.debug_find_chunk();
	}

	if (!r.find_chunk(GAMEMTL_CHUNK_FLAGS))
		xr_not_expected();
	flags = r.r_u32();
	r.debug_find_chunk();

	if (!r.find_chunk(GAMEMTL_CHUNK_PHYSICS))
		xr_not_expected();
	friction = r.r_float();
	damping = r.r_float();
	spring = r.r_float();
	bouncing_start_velocity = r.r_float();
	bounce = r.r_float();
	r.debug_find_chunk();

	if (!r.find_chunk(GAMEMTL_CHUNK_FACTORS))
		xr_not_expected();
	shoot_factor = r.r_float();
	bounce_damage_factor = r.r_float();
	vis_transparency_factor = r.r_float();
	snd_occlusion_factor = r.r_float();
	r.debug_find_chunk();

	//in build 1580 not present
	if (!r.r_chunk<float>(GAMEMTL_CHUNK_FLOTATION, flotation_factor))
		flotation_factor = 1.0f;

	//in build 1865 not present
	if (!r.r_chunk<float>(GAMEMTL_CHUNK_INJURY, injurious_speed))
		injurious_speed = 0.0f;
}